

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLColladaParserAutoGen14Private.cpp
# Opt level: O3

UNION__gl_enumeration __thiscall
COLLADASaxFWL14::ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration
          (ColladaParserAutoGen14Private *this,ParserChar *prefixedBuffer,
          ParserChar *prefixedBufferEnd,ParserChar **buffer,ParserChar *bufferEnd,bool *failed)

{
  ParserChar *__dest;
  UNION__gl_enumeration UVar1;
  byte *pbVar2;
  byte *__src;
  size_t __n;
  size_t __n_00;
  ParserChar *__dest_00;
  ParserChar *newBufferPostParse;
  ParserChar *local_38;
  
  if (prefixedBuffer != prefixedBufferEnd) {
    __src = (byte *)0x0;
    do {
      pbVar2 = __src;
      if (__src == (byte *)0x0) {
        pbVar2 = (byte *)prefixedBuffer;
      }
      if ((0x100002600U >> (*prefixedBuffer & 0x3fU) & 1) == 0) {
        __src = pbVar2;
      }
      if (0x20 < (byte)*prefixedBuffer) {
        __src = pbVar2;
      }
      prefixedBuffer = (ParserChar *)((byte *)prefixedBuffer + 1);
    } while (prefixedBuffer != prefixedBufferEnd);
    if (__src != (byte *)0x0) {
      __n = 0;
      while ((0x20 < (ulong)(byte)(*buffer)[__n] ||
             ((0x100002600U >> ((ulong)(byte)(*buffer)[__n] & 0x3f) & 1) == 0))) {
        __n = __n + 1;
      }
      __n_00 = (long)prefixedBufferEnd - (long)__src;
      __dest = (ParserChar *)
               GeneratedSaxParser::StackMemoryManager::newObject
                         (&(this->
                           super_ParserTemplate<COLLADASaxFWL14::ColladaParserAutoGen14Private,_COLLADASaxFWL14::ColladaParserAutoGen14>
                           ).super_ParserTemplateBase.mStackMemoryManager,__n_00 + __n + 1);
      memcpy(__dest,__src,__n_00);
      __dest_00 = __dest + __n_00;
      memcpy(__dest_00,*buffer,__n);
      __dest_00[__n] = ' ';
      local_38 = __dest;
      UVar1 = toUnion_UNION__gl_enumeration(&local_38,__dest + __n_00 + __n + 1,failed);
      *buffer = *buffer + ((long)local_38 - (long)__dest_00);
      return UVar1;
    }
  }
  UVar1 = toUnion_UNION__gl_enumeration(buffer,bufferEnd,failed);
  return UVar1;
}

Assistant:

UNION__gl_enumeration ColladaParserAutoGen14Private::toUnionPrefix_UNION__gl_enumeration (
    const ParserChar* prefixedBuffer,
    const ParserChar* prefixedBufferEnd,
    const ParserChar** buffer,
    const ParserChar* bufferEnd,
    bool& failed
)
{
    return toDataPrefix<UNION__gl_enumeration>(prefixedBuffer, prefixedBufferEnd, buffer, bufferEnd, failed, toUnion_UNION__gl_enumeration);
}